

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O3

void __thiscall BindingEnv::AddRule(BindingEnv *this,Rule *rule)

{
  iterator iVar1;
  mapped_type *ppRVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
          ::find(&(this->rules_)._M_t,&rule->name_);
  if (((_Rb_tree_header *)iVar1._M_node != &(this->rules_)._M_t._M_impl.super__Rb_tree_header) &&
     (*(long *)(iVar1._M_node + 2) != 0)) {
    __assert_fail("LookupRuleCurrentScope(rule->name()) == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/eval_env.cc"
                  ,0x23,"void BindingEnv::AddRule(const Rule *)");
  }
  ppRVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
            ::operator[](&this->rules_,&rule->name_);
  *ppRVar2 = rule;
  return;
}

Assistant:

void BindingEnv::AddRule(const Rule* rule) {
  assert(LookupRuleCurrentScope(rule->name()) == NULL);
  rules_[rule->name()] = rule;
}